

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_lrzip.c
# Opt level: O2

void test_option_lrzip(void)

{
  wchar_t wVar1;
  char *pcVar2;
  undefined8 uVar3;
  size_t s;
  
  wVar1 = canLrzip();
  if (wVar1 != L'\0') {
    assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_lrzip.c"
                        ,L'\x15',"f",L'Ƥ',L'\xffffffff',"a");
    wVar1 = systemf("echo f | %s -o --lrzip >archive.out 2>archive.err",testprog);
    uVar3 = 0;
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_lrzip.c"
                        ,L'\x1a',0,"0",(long)wVar1,
                        "systemf(\"echo f | %s -o --lrzip >archive.out 2>archive.err\", testprog)",
                        (void *)0x0);
    pcVar2 = slurpfile(&s,"archive.err",0x10c94f,uVar3);
    free(pcVar2);
    pcVar2 = slurpfile(&s,"archive.out");
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_lrzip.c"
                     ,L'\x1f',(uint)(2 < s),"s > 2",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_lrzip.c"
                        ,L' ',pcVar2,"p","LRZI","\"LRZI\\x00\"",5,"5",(void *)0x0);
    free(pcVar2);
    return;
  }
  skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_lrzip.c"
                 ,L'\x10');
  test_skipping("lrzip is not supported on this platform");
  return;
}

Assistant:

DEFINE_TEST(test_option_lrzip)
{
	char *p;
	size_t s;

	if (!canLrzip()) {
		skipping("lrzip is not supported on this platform");
		return;
	}

	/* Create a file. */
	assertMakeFile("f", 0644, "a");

	/* Archive it with lrzip compression. */
	assertEqualInt(0,
	    systemf("echo f | %s -o --lrzip >archive.out 2>archive.err",
	    testprog));
	p = slurpfile(&s, "archive.err");
	free(p);
	/* Check that the archive file has an lzma signature. */
	p = slurpfile(&s, "archive.out");
	assert(s > 2);
	assertEqualMem(p, "LRZI\x00", 5);
	free(p);
}